

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O2

glyph_metrics_t * __thiscall
QFontEngineFT::scaledBitmapMetrics
          (glyph_metrics_t *__return_storage_ptr__,QFontEngineFT *this,glyph_metrics_t *m,
          QTransform *t)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  double sx;
  long lVar8;
  qreal *pqVar9;
  qreal *pqVar10;
  long in_FS_OFFSET;
  QPointF QVar11;
  QRectF local_d8;
  QPointF local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  QTransform trans;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar9 = (qreal *)&DAT_00613968;
  pqVar10 = (qreal *)&trans;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pqVar10 = *pqVar9;
    pqVar9 = pqVar9 + 1;
    pqVar10 = pqVar10 + 1;
  }
  pqVar9 = (qreal *)&DAT_00613a58;
  pqVar10 = (qreal *)&trans;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pqVar10 = *pqVar9;
    pqVar9 = pqVar9 + 1;
    pqVar10 = pqVar10 + 1;
  }
  trans._72_2_ = 0xa800;
  QTransform::setMatrix
            (&trans,t->m_matrix[0][0],t->m_matrix[0][1],t->m_matrix[0][2],t->m_matrix[1][0],
             t->m_matrix[1][1],t->m_matrix[1][2],0.0,0.0,t->m_matrix[2][2]);
  sx = (double)(this->scalableBitmapScaleFactor).val * 0.015625;
  QTransform::scale(&trans,sx,sx);
  uVar1 = m->x;
  uVar4 = m->y;
  local_a8._8_4_ = SUB84((double)(int)uVar4 * 0.015625,0);
  local_a8._0_8_ = (double)(int)uVar1 * 0.015625;
  local_a8._12_4_ = (int)((ulong)((double)(int)uVar4 * 0.015625) >> 0x20);
  uVar2 = m->width;
  uVar5 = m->height;
  local_98._8_4_ = SUB84((double)(int)uVar5 * 0.015625,0);
  local_98._0_8_ = (double)(int)uVar2 * 0.015625;
  local_98._12_4_ = (int)((ulong)((double)(int)uVar5 * 0.015625) >> 0x20);
  uVar3 = m->xoff;
  uVar6 = m->yoff;
  local_b8.yp._0_4_ = SUB84((double)(int)uVar6 * 0.015625,0);
  local_b8.xp = (double)(int)uVar3 * 0.015625;
  local_b8.yp._4_4_ = (int)((ulong)((double)(int)uVar6 * 0.015625) >> 0x20);
  QTransform::mapRect(&local_d8,&trans,(QRectF *)local_a8);
  local_98._0_8_ = local_d8.w;
  local_98._8_8_ = local_d8.h;
  local_a8._0_8_ = local_d8.xp;
  local_a8._8_8_ = local_d8.yp;
  QVar11 = QTransform::map(&trans,&local_b8);
  (__return_storage_ptr__->x).val = (int)((double)local_a8._0_8_ * 64.0);
  (__return_storage_ptr__->y).val = (int)((double)local_a8._8_8_ * 64.0);
  (__return_storage_ptr__->width).val = (int)((double)local_98._0_8_ * 64.0);
  (__return_storage_ptr__->height).val = (int)((double)local_98._8_8_ * 64.0);
  __return_storage_ptr__->xoff = (QFixed)(int)(QVar11.xp * 64.0);
  __return_storage_ptr__->yoff = (QFixed)(int)(QVar11.yp * 64.0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

glyph_metrics_t QFontEngineFT::scaledBitmapMetrics(const glyph_metrics_t &m, const QTransform &t) const
{
    QTransform trans;
    trans.setMatrix(t.m11(), t.m12(), t.m13(),
                    t.m21(), t.m22(), t.m23(),
                    0, 0, t.m33());
    const qreal scaleFactor = scalableBitmapScaleFactor.toReal();
    trans.scale(scaleFactor, scaleFactor);

    QRectF rect(m.x.toReal(), m.y.toReal(), m.width.toReal(), m.height.toReal());
    QPointF offset(m.xoff.toReal(), m.yoff.toReal());

    rect = trans.mapRect(rect);
    offset = trans.map(offset);

    glyph_metrics_t metrics;
    metrics.x = QFixed::fromReal(rect.x());
    metrics.y = QFixed::fromReal(rect.y());
    metrics.width = QFixed::fromReal(rect.width());
    metrics.height = QFixed::fromReal(rect.height());
    metrics.xoff = QFixed::fromReal(offset.x());
    metrics.yoff = QFixed::fromReal(offset.y());
    return metrics;
}